

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp_fun.c
# Opt level: O2

void ex_random(t_expr *e,long argc,ex_ex *argv,ex_ex *optr)

{
  float fVar1;
  t_float *ptVar2;
  t_float *ptVar3;
  int iVar4;
  int iVar5;
  t_float *ptVar6;
  long lVar7;
  t_float i2;
  char *fmt;
  t_float i1;
  long lVar8;
  
  lVar7 = argv->ex_type;
  if (lVar7 - 0xeU < 2) {
    if (optr->ex_type == 0xf) {
      ptVar6 = (optr->ex_cont).v_vec;
    }
    else {
      if (optr->ex_type == 0xe) {
LAB_00192a66:
        post("expr~: Int. error %d",0x3da);
        abort();
      }
      optr->ex_type = 0xf;
      ptVar6 = (t_float *)malloc((long)e->exp_vsize << 2);
      (optr->ex_cont).v_vec = ptVar6;
    }
    ptVar3 = (argv->ex_cont).v_vec;
    lVar7 = argv[1].ex_type;
    if (lVar7 - 0xeU < 2) {
      ptVar2 = argv[1].ex_cont.v_vec;
      iVar5 = e->exp_vsize;
      for (lVar7 = 0; iVar5 != (int)lVar7; lVar7 = lVar7 + 1) {
        iVar4 = ex_dorandom((int)ptVar3[lVar7],(int)ptVar2[lVar7]);
        ptVar6[lVar7] = (float)iVar4;
      }
      return;
    }
    if (lVar7 == 2) {
      iVar5 = e->exp_vsize;
      fVar1 = argv[1].ex_cont.v_flt;
      for (lVar7 = 0; iVar5 != (int)lVar7; lVar7 = lVar7 + 1) {
        iVar4 = ex_dorandom((int)ptVar3[lVar7],(int)fVar1);
        ptVar6[lVar7] = (float)iVar4;
      }
      return;
    }
    if (lVar7 == 1) {
      lVar7 = argv[1].ex_cont.v_int;
      iVar5 = e->exp_vsize;
      for (lVar8 = 0; iVar5 != (int)lVar8; lVar8 = lVar8 + 1) {
        iVar4 = ex_dorandom((int)ptVar3[lVar8],(int)(float)lVar7);
        ptVar6[lVar8] = (float)iVar4;
      }
      return;
    }
  }
  else if (lVar7 == 2) {
    lVar7 = argv[1].ex_type;
    if (lVar7 - 0xeU < 2) {
      if (optr->ex_type == 0xf) {
        ptVar6 = (optr->ex_cont).v_vec;
      }
      else {
        if (optr->ex_type == 0xe) goto LAB_00192a66;
        optr->ex_type = 0xf;
        ptVar6 = (t_float *)malloc((long)e->exp_vsize << 2);
        (optr->ex_cont).v_vec = ptVar6;
      }
      ptVar3 = argv[1].ex_cont.v_vec;
      iVar5 = e->exp_vsize;
      fVar1 = (argv->ex_cont).v_flt;
      for (lVar7 = 0; iVar5 != (int)lVar7; lVar7 = lVar7 + 1) {
        iVar4 = ex_dorandom((int)fVar1,(int)ptVar3[lVar7]);
        ptVar6[lVar7] = (float)iVar4;
      }
      return;
    }
    if (lVar7 == 2) {
      if (optr->ex_type == 0xf) {
        ptVar6 = (optr->ex_cont).v_vec;
        iVar4 = ex_dorandom((int)(argv->ex_cont).v_flt,(int)argv[1].ex_cont.v_flt);
        iVar5 = e->exp_vsize;
        for (lVar7 = 0; iVar5 != (int)lVar7; lVar7 = lVar7 + 1) {
          ptVar6[lVar7] = (float)iVar4;
        }
        return;
      }
      optr->ex_type = 2;
      i1 = (t_float)(int)(argv->ex_cont).v_flt;
LAB_00192a48:
      i2 = (t_float)(int)argv[1].ex_cont.v_flt;
LAB_00192a4e:
      iVar5 = ex_dorandom((int)i1,(int)i2);
      (optr->ex_cont).v_flt = (float)iVar5;
      return;
    }
    if (lVar7 == 1) {
      if (optr->ex_type == 0xf) {
        ptVar6 = (optr->ex_cont).v_vec;
        iVar4 = ex_dorandom((int)(argv->ex_cont).v_flt,(int)argv[1].ex_cont.v_flt);
        iVar5 = e->exp_vsize;
        for (lVar7 = 0; iVar5 != (int)lVar7; lVar7 = lVar7 + 1) {
          ptVar6[lVar7] = (float)iVar4;
        }
        return;
      }
      optr->ex_type = 2;
      i1 = (t_float)(int)(argv->ex_cont).v_flt;
      i2 = argv[1].ex_cont.v_flt;
      goto LAB_00192a4e;
    }
  }
  else {
    if (lVar7 != 1) {
      fmt = "expr: FUNC_EVAL(%d): bad left type %ld\n";
      goto LAB_00192819;
    }
    lVar7 = argv[1].ex_type;
    if (lVar7 - 0xeU < 2) {
      if (optr->ex_type == 0xf) {
        ptVar6 = (optr->ex_cont).v_vec;
      }
      else {
        if (optr->ex_type == 0xe) goto LAB_00192a66;
        optr->ex_type = 0xf;
        ptVar6 = (t_float *)malloc((long)e->exp_vsize << 2);
        (optr->ex_cont).v_vec = ptVar6;
      }
      lVar7 = (argv->ex_cont).v_int;
      ptVar3 = argv[1].ex_cont.v_vec;
      iVar5 = e->exp_vsize;
      for (lVar8 = 0; iVar5 != (int)lVar8; lVar8 = lVar8 + 1) {
        iVar4 = ex_dorandom((int)(float)lVar7,(int)ptVar3[lVar8]);
        ptVar6[lVar8] = (float)iVar4;
      }
      return;
    }
    if (lVar7 == 2) {
      if (optr->ex_type == 0xf) {
        ptVar6 = (optr->ex_cont).v_vec;
        iVar4 = ex_dorandom((int)(argv->ex_cont).v_flt,(int)argv[1].ex_cont.v_flt);
        iVar5 = e->exp_vsize;
        for (lVar7 = 0; iVar5 != (int)lVar7; lVar7 = lVar7 + 1) {
          ptVar6[lVar7] = (float)iVar4;
        }
        return;
      }
      optr->ex_type = 2;
      i1 = (argv->ex_cont).v_flt;
      goto LAB_00192a48;
    }
    if (lVar7 == 1) {
      if (optr->ex_type == 0xf) {
        ptVar6 = (optr->ex_cont).v_vec;
        iVar4 = ex_dorandom((int)(argv->ex_cont).v_flt,(int)argv[1].ex_cont.v_flt);
        iVar5 = e->exp_vsize;
        for (lVar7 = 0; iVar5 != (int)lVar7; lVar7 = lVar7 + 1) {
          ptVar6[lVar7] = (float)iVar4;
        }
        return;
      }
      optr->ex_type = 1;
      iVar5 = ex_dorandom((int)(argv->ex_cont).v_flt,(int)argv[1].ex_cont.v_flt);
      optr->ex_cont = (anon_union_8_5_735de1bb_for_ex_cont)(long)iVar5;
      return;
    }
  }
  fmt = "expr: FUNC_EVAL(%d): bad right type %ld\n";
LAB_00192819:
  pd_error(e,fmt,0x3da);
  return;
}

Assistant:

static void
ex_random(t_expr *e, long int argc, struct ex_ex *argv, struct ex_ex *optr)
{
        struct ex_ex *left, *right;
        t_float *op; /* output pointer */
        t_float *lp, *rp;         /* left and right vector pointers */
        t_float scalar;
        int j;

        left = argv++;
        right = argv;
        FUNC_EVAL(left, right, ex_dorandom, (int), (int), optr, 0);
}